

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O1

void __thiscall adios2::core::engine::BP5Writer::~BP5Writer(BP5Writer *this)

{
  pointer pCVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer puVar2;
  pointer pcVar3;
  
  (this->super_Engine)._vptr_Engine = (_func_int **)&PTR__BP5Writer_0087fd08;
  if ((this->super_Engine).m_IsOpen == true) {
    DestructorClose(this,(this->super_Engine).m_FailVerbose);
  }
  (this->super_Engine).m_IsOpen = false;
  pCVar1 = (this->m_ComputationBlockTimes).
           super__Vector_base<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pCVar1 != (pointer)0x0) {
    operator_delete(pCVar1);
  }
  this_00 = (this->m_WriteFuture).super___basic_future<int>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  puVar2 = (this->m_AppendDataPos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  puVar2 = (this->m_WriterSubfileMap).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&this->FlushPosSizeInfo);
  puVar2 = (this->m_WriterDataPos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->m_Profiler).m_Profiler.m_Bytes._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&this->m_Profiler);
  helper::Comm::~Comm(&this->m_CommMetadataAggregators);
  aggregator::MPIAggregator::~MPIAggregator(&(this->m_AggregatorMetadata).super_MPIAggregator);
  helper::Comm::~Comm(&this->m_CommAggregators);
  aggregator::MPIAggregator::~MPIAggregator(&(this->m_AggregatorEveroneWrites).super_MPIAggregator);
  aggregator::MPIShmChain::~MPIShmChain(&this->m_AggregatorTwoLevelShm);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_ActiveFlagFileNames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_DrainMetadataIndexFileNames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_MetadataIndexFileNames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_MetaMetadataFileNames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_DrainMetadataFileNames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_MetadataFileNames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_DrainSubStreamNames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_SubStreamNames);
  pcVar3 = (this->m_BBName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->m_BBName).field_2) {
    operator_delete(pcVar3);
  }
  burstbuffer::FileDrainerSingleThread::~FileDrainerSingleThread(&this->m_FileDrainer);
  (this->m_FileMetaMetadataManager)._vptr_TransportMan = (_func_int **)&PTR__TransportMan_0087d458;
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->m_FileMetaMetadataManager).m_Transports._M_h);
  (this->m_FileMetadataIndexManager)._vptr_TransportMan = (_func_int **)&PTR__TransportMan_0087d458;
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->m_FileMetadataIndexManager).m_Transports._M_h);
  (this->m_FileMetadataManager)._vptr_TransportMan = (_func_int **)&PTR__TransportMan_0087d458;
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->m_FileMetadataManager).m_Transports._M_h);
  (this->m_FileDataManager)._vptr_TransportMan = (_func_int **)&PTR__TransportMan_0087d458;
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->m_FileDataManager).m_Transports._M_h);
  adios2::format::BP5Serializer::~BP5Serializer(&this->m_BP5Serializer);
  Engine::~Engine(&this->super_Engine);
  pcVar3 = (this->super_BP5Engine).m_Parameters.UUID._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->super_BP5Engine).m_Parameters.UUID.field_2) {
    operator_delete(pcVar3);
  }
  pcVar3 = (this->super_BP5Engine).m_Parameters.RemoteHost._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->super_BP5Engine).m_Parameters.RemoteHost.field_2) {
    operator_delete(pcVar3);
  }
  pcVar3 = (this->super_BP5Engine).m_Parameters.RemoteDataPath._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->super_BP5Engine).m_Parameters.RemoteDataPath.field_2) {
    operator_delete(pcVar3);
  }
  pcVar3 = (this->super_BP5Engine).m_Parameters.SelectSteps._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->super_BP5Engine).m_Parameters.SelectSteps.field_2) {
    operator_delete(pcVar3);
  }
  pcVar3 = (this->super_BP5Engine).m_Parameters.BurstBufferPath._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->super_BP5Engine).m_Parameters.BurstBufferPath.field_2) {
    operator_delete(pcVar3);
  }
  adios2::format::BufferSTL::~BufferSTL(&(this->super_BP5Engine).m_MetadataIndex);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->super_BP5Engine).m_MetadataIndexTable._M_h);
  return;
}

Assistant:

BP5Writer::~BP5Writer()
{
    if (m_IsOpen)
    {
        DestructorClose(m_FailVerbose);
    }
    m_IsOpen = false;
}